

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

ssize_t trp_ly_out_clb_func(void *user_data,void *buf,size_t count)

{
  ly_out_clb_arg *data;
  LY_ERR erc;
  size_t count_local;
  void *buf_local;
  void *user_data_local;
  
  data._4_4_ = LY_SUCCESS;
  if (*user_data == 0) {
    data._4_4_ = ly_write_(*(ly_out **)((long)user_data + 8),(char *)buf,count);
  }
  else if (*user_data == 1) {
    *(size_t *)((long)user_data + 0x10) = *(long *)((long)user_data + 0x10) + count;
  }
  user_data_local = (void *)count;
  if (data._4_4_ != LY_SUCCESS) {
    *(LY_ERR *)((long)user_data + 0x18) = data._4_4_;
    user_data_local = (void *)0xffffffffffffffff;
  }
  return (ssize_t)user_data_local;
}

Assistant:

static ssize_t
trp_ly_out_clb_func(void *user_data, const void *buf, size_t count)
{
    LY_ERR erc = LY_SUCCESS;
    struct ly_out_clb_arg *data = (struct ly_out_clb_arg *)user_data;

    switch (data->mode) {
    case TRD_PRINT:
        erc = ly_write_(data->out, buf, count);
        break;
    case TRD_CHAR_COUNT:
        data->counter = data->counter + count;
        break;
    default:
        break;
    }

    if (erc != LY_SUCCESS) {
        data->last_error = erc;
        return -1;
    } else {
        return count;
    }
}